

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode output_auth_headers(Curl_easy *data,connectdata *conn,auth *authstatus,char *request,
                            char *path,_Bool proxy)

{
  CURLcode CVar1;
  long lVar2;
  unsigned_long uVar3;
  char *pcVar4;
  size_t insize;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  char *pcVar9;
  size_t size;
  char *local_48;
  long local_40;
  size_t local_38;
  
  uVar3 = authstatus->picked;
  pcVar9 = (char *)0x0;
  if ((long)uVar3 < 8) {
    if (uVar3 != 1) {
      if (uVar3 == 2) {
        CVar1 = Curl_output_digest(data,proxy,(uchar *)request,(uchar *)path);
        if (CVar1 != CURLE_OK) {
          return CVar1;
        }
        pcVar9 = "Digest";
        goto LAB_0069a6a2;
      }
      goto LAB_0069a6a6;
    }
    if (!proxy) {
      if (((data->state).aptr.user != (char *)0x0) &&
         (pcVar9 = Curl_checkheaders(data,"Authorization",0xd), pcVar9 == (char *)0x0)) {
        lVar8 = 0x12f0;
        lVar5 = 0x1328;
        lVar2 = 0x1330;
        goto LAB_0069a7ab;
      }
LAB_0069a692:
      pcVar9 = (char *)0x0;
LAB_0069a695:
      authstatus->field_0x18 = authstatus->field_0x18 | 1;
      goto LAB_0069a6a2;
    }
    if ((((uint)conn->bits & 4) == 0) ||
       (pcVar9 = Curl_checkProxyheaders(data,conn,"Proxy-authorization",0x13), pcVar9 != (char *)0x0
       )) goto LAB_0069a692;
    lVar8 = 0x12d8;
    lVar5 = 0x1338;
    lVar2 = 0x1340;
LAB_0069a7ab:
    local_38 = 0;
    local_48 = (char *)0x0;
    pcVar9 = *(char **)((long)&data->magic + lVar5);
    pcVar4 = "";
    if (pcVar9 == (char *)0x0) {
      pcVar9 = "";
    }
    pcVar6 = *(char **)((long)&data->magic + lVar2);
    if (pcVar6 == (char *)0x0) {
      pcVar6 = "";
    }
    pcVar9 = curl_maprintf("%s:%s",pcVar9,pcVar6);
    if (pcVar9 != (char *)0x0) {
      local_40 = lVar8;
      insize = strlen(pcVar9);
      CVar1 = Curl_base64_encode(pcVar9,insize,&local_48,&local_38);
      lVar2 = local_40;
      if (CVar1 != CURLE_OK) {
LAB_0069a810:
        (*Curl_cfree)(pcVar9);
        return CVar1;
      }
      if (local_48 == (char *)0x0) {
        CVar1 = CURLE_REMOTE_ACCESS_DENIED;
        goto LAB_0069a810;
      }
      (*Curl_cfree)(*(void **)((long)&data->magic + local_40));
      if (proxy) {
        pcVar4 = "Proxy-";
      }
      pcVar4 = curl_maprintf("%sAuthorization: Basic %s\r\n",pcVar4,local_48);
      *(char **)((long)&data->magic + lVar2) = pcVar4;
      (*Curl_cfree)(local_48);
      if (*(long *)((long)&data->magic + lVar2) == 0) {
        CVar1 = CURLE_OUT_OF_MEMORY;
        goto LAB_0069a810;
      }
      (*Curl_cfree)(pcVar9);
      pcVar9 = "Basic";
      goto LAB_0069a695;
    }
LAB_0069a821:
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    if (uVar3 == 8) {
      CVar1 = Curl_output_ntlm(data,proxy);
      if (CVar1 != CURLE_OK) {
        return CVar1;
      }
      pcVar9 = "NTLM";
    }
    else {
      if (uVar3 != 0x80) goto LAB_0069a6a6;
      CVar1 = Curl_output_aws_sigv4(data,proxy);
      if (CVar1 != CURLE_OK) {
        return CVar1;
      }
      pcVar9 = "AWS_SIGV4";
    }
LAB_0069a6a2:
    uVar3 = authstatus->picked;
LAB_0069a6a6:
    if (uVar3 == 0x40) {
      if (((!proxy) && ((data->set).str[0x40] != (char *)0x0)) &&
         (pcVar4 = Curl_checkheaders(data,"Authorization",0xd), pcVar4 == (char *)0x0)) {
        (*Curl_cfree)((data->state).aptr.userpwd);
        pcVar9 = curl_maprintf("Authorization: Bearer %s\r\n",(data->set).str[0x40]);
        (data->state).aptr.userpwd = pcVar9;
        if (pcVar9 == (char *)0x0) goto LAB_0069a821;
        pcVar9 = "Bearer";
      }
      authstatus->field_0x18 = authstatus->field_0x18 | 1;
    }
    if (pcVar9 == (char *)0x0) {
      authstatus->field_0x18 = authstatus->field_0x18 & 0xfd;
    }
    else {
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
        pcVar4 = "Server";
        if (proxy) {
          pcVar4 = "Proxy";
        }
        pcVar6 = (&(data->state).aptr.user)[(ulong)proxy * 2];
        pcVar7 = "";
        if (pcVar6 != (char *)0x0) {
          pcVar7 = pcVar6;
        }
        Curl_infof(data,"%s auth using %s with user \'%s\'",pcVar4,pcVar9,pcVar7);
      }
      authstatus->field_0x18 =
           (authstatus->field_0x18 & 0xfd | authstatus->field_0x18 * '\x02' & 2U) ^ 2;
    }
    CVar1 = CURLE_OK;
  }
  return CVar1;
}

Assistant:

static CURLcode
output_auth_headers(struct Curl_easy *data,
                    struct connectdata *conn,
                    struct auth *authstatus,
                    const char *request,
                    const char *path,
                    bool proxy)
{
  const char *auth = NULL;
  CURLcode result = CURLE_OK;
  (void)conn;

#ifdef CURL_DISABLE_DIGEST_AUTH
  (void)request;
  (void)path;
#endif
#ifndef CURL_DISABLE_AWS
  if(authstatus->picked == CURLAUTH_AWS_SIGV4) {
    auth = "AWS_SIGV4";
    result = Curl_output_aws_sigv4(data, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifdef USE_SPNEGO
  if(authstatus->picked == CURLAUTH_NEGOTIATE) {
    auth = "Negotiate";
    result = Curl_output_negotiate(data, conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifdef USE_NTLM
  if(authstatus->picked == CURLAUTH_NTLM) {
    auth = "NTLM";
    result = Curl_output_ntlm(data, proxy);
    if(result)
      return result;
  }
  else
#endif
#if defined(USE_NTLM) && defined(NTLM_WB_ENABLED)
  if(authstatus->picked == CURLAUTH_NTLM_WB) {
    auth = "NTLM_WB";
    result = Curl_output_ntlm_wb(data, conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifndef CURL_DISABLE_DIGEST_AUTH
  if(authstatus->picked == CURLAUTH_DIGEST) {
    auth = "Digest";
    result = Curl_output_digest(data,
                                proxy,
                                (const unsigned char *)request,
                                (const unsigned char *)path);
    if(result)
      return result;
  }
  else
#endif
#ifndef CURL_DISABLE_BASIC_AUTH
  if(authstatus->picked == CURLAUTH_BASIC) {
    /* Basic */
    if(
#ifndef CURL_DISABLE_PROXY
      (proxy && conn->bits.proxy_user_passwd &&
       !Curl_checkProxyheaders(data, conn, STRCONST("Proxy-authorization"))) ||
#endif
      (!proxy && data->state.aptr.user &&
       !Curl_checkheaders(data, STRCONST("Authorization")))) {
      auth = "Basic";
      result = http_output_basic(data, proxy);
      if(result)
        return result;
    }

    /* NOTE: this function should set 'done' TRUE, as the other auth
       functions work that way */
    authstatus->done = TRUE;
  }
#endif
#ifndef CURL_DISABLE_BEARER_AUTH
  if(authstatus->picked == CURLAUTH_BEARER) {
    /* Bearer */
    if((!proxy && data->set.str[STRING_BEARER] &&
        !Curl_checkheaders(data, STRCONST("Authorization")))) {
      auth = "Bearer";
      result = http_output_bearer(data);
      if(result)
        return result;
    }

    /* NOTE: this function should set 'done' TRUE, as the other auth
       functions work that way */
    authstatus->done = TRUE;
  }
#endif

  if(auth) {
#ifndef CURL_DISABLE_PROXY
    infof(data, "%s auth using %s with user '%s'",
          proxy ? "Proxy" : "Server", auth,
          proxy ? (data->state.aptr.proxyuser ?
                   data->state.aptr.proxyuser : "") :
          (data->state.aptr.user ?
           data->state.aptr.user : ""));
#else
    (void)proxy;
    infof(data, "Server auth using %s with user '%s'",
          auth, data->state.aptr.user ?
          data->state.aptr.user : "");
#endif
    authstatus->multipass = (!authstatus->done) ? TRUE : FALSE;
  }
  else
    authstatus->multipass = FALSE;

  return result;
}